

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info_manager.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::analysis::DebugInfoManager::IsAncestorOfScope
          (DebugInfoManager *this,uint32_t scope,uint32_t ancestor)

{
  bool bVar1;
  
  bVar1 = scope != 0;
  if (scope != ancestor && bVar1) {
    do {
      scope = GetParentScope(this,scope);
      bVar1 = scope != 0;
      if (scope == ancestor) {
        return bVar1;
      }
    } while (scope != 0);
  }
  return bVar1;
}

Assistant:

bool DebugInfoManager::IsAncestorOfScope(uint32_t scope, uint32_t ancestor) {
  uint32_t ancestor_scope_itr = scope;
  while (ancestor_scope_itr != kNoDebugScope) {
    if (ancestor == ancestor_scope_itr) return true;
    ancestor_scope_itr = GetParentScope(ancestor_scope_itr);
  }
  return false;
}